

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  size_type *psVar1;
  Error EVar2;
  uint uVar3;
  Error extraout_EAX;
  CodeHolder *pCVar4;
  CodeHolder *extraout_RAX;
  void *in_RCX;
  size_t __n;
  size_t extraout_RDX;
  CodeHolder *pCVar5;
  CodeHolder *pCVar6;
  CodeHolder *pCVar7;
  long lVar8;
  long lVar9;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar2 = 2;
  }
  else if (emitter->_emitterType - 4 < 0xfffffffd) {
    EVar2 = 3;
  }
  else if (emitter->_code == (CodeHolder *)0x0) {
    if ((this->_emitters).super_ZoneVectorBase._capacity ==
        (this->_emitters).super_ZoneVectorBase._size) {
      in_RCX = (void *)0x1;
      EVar2 = ZoneVectorBase::_grow(&(this->_emitters).super_ZoneVectorBase,&this->_allocator,8,1);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    pCVar5 = this;
    pCVar7 = (CodeHolder *)emitter;
    EVar2 = (*emitter->_vptr_BaseEmitter[0x10])();
    if (EVar2 == 0) {
      if (emitter->_code == this) {
        uVar3 = (this->_emitters).super_ZoneVectorBase._size;
        if (uVar3 < (this->_emitters).super_ZoneVectorBase._capacity) {
          *(BaseEmitter **)((long)(this->_emitters).super_ZoneVectorBase._data + (ulong)uVar3 * 8) =
               emitter;
          psVar1 = &(this->_emitters).super_ZoneVectorBase._size;
          *psVar1 = *psVar1 + 1;
          return 0;
        }
      }
      else {
        attach();
      }
      attach();
      if (pCVar5 == (CodeHolder *)0x0) {
        EVar2 = 2;
      }
      else if ((CodeHolder *)pCVar5->_errorHandler == pCVar7) {
        if ((char)*(uint8_t *)((long)&pCVar5->_baseAddress + 1) < '\0') {
          EVar2 = 0;
          pCVar6 = pCVar5;
        }
        else {
          pCVar6 = pCVar7;
          EVar2 = (**(_func_int **)((long)pCVar5->_environment + 0x88))(pCVar5);
        }
        uVar3 = (pCVar7->_emitters).super_ZoneVectorBase._size;
        pCVar4 = (CodeHolder *)(ulong)uVar3;
        if (pCVar4 != (CodeHolder *)0x0) {
          in_RCX = (pCVar7->_emitters).super_ZoneVectorBase._data;
          __n = (ulong)(uVar3 - 1) << 3;
          pCVar6 = (CodeHolder *)0x0;
          do {
            if (*(CodeHolder **)((long)in_RCX + (long)pCVar6 * 8) == pCVar5) goto LAB_00113cf3;
            pCVar6 = (CodeHolder *)&(pCVar6->_environment)._subArch;
            __n = __n - 8;
          } while (pCVar4 != pCVar6);
        }
        do {
          detach();
          pCVar4 = extraout_RAX;
          __n = extraout_RDX;
LAB_00113cf3:
          lVar8 = 0xffffffff;
        } while (pCVar6 == (CodeHolder *)0xffffffff);
        if (pCVar4 <= pCVar6) {
          detach();
          *(CodeHolder **)(lVar8 + 0x10) = pCVar6;
          uVar3 = *(uint *)(lVar8 + 0xa8);
          EVar2 = extraout_EAX;
          if ((ulong)uVar3 != 0) {
            lVar8 = *(long *)(lVar8 + 0xa0);
            lVar9 = 0;
            do {
              EVar2 = (**(code **)(**(long **)(lVar8 + lVar9) + 0x90))();
              lVar9 = lVar9 + 8;
            } while ((ulong)uVar3 << 3 != lVar9);
          }
          return EVar2;
        }
        uVar3 = (int)pCVar4 - 1;
        (pCVar7->_emitters).super_ZoneVectorBase._size = uVar3;
        if ((CodeHolder *)(ulong)uVar3 != pCVar6) {
          memmove((void *)((long)in_RCX + (long)pCVar6 * 8),
                  (void *)((long)in_RCX + (long)pCVar6 * 8 + 8),__n);
        }
        pCVar5->_errorHandler = (ErrorHandler *)0x0;
      }
      else {
        EVar2 = 3;
      }
      return EVar2;
    }
  }
  else {
    EVar2 = (uint)(emitter->_code != this) * 3;
  }
  return EVar2;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  uint32_t type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == BaseEmitter::kTypeNone || type >= BaseEmitter::kTypeCount))
    return DebugUtils::errored(kErrorInvalidState);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}